

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O0

void __thiscall
SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
::Map<Memory::Recycler::PrintPinnedObjectStackTraces()::__0>
          (SimpleHashTable<void*,Memory::Recycler::PinRecord,Memory::HeapAllocator,DefaultComparer,true,PrimePolicy>
           *this,anon_class_8_1_8991fb9c fn)

{
  uint local_24;
  undefined8 *puStack_20;
  uint i;
  EntryType *current;
  SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
  *this_local;
  anon_class_8_1_8991fb9c fn_local;
  
  this_local = (SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
                *)fn.this;
  for (local_24 = 0; local_24 < *(uint *)(this + 0x1c); local_24 = local_24 + 1) {
    for (puStack_20 = *(undefined8 **)(*(long *)(this + 8) + (ulong)local_24 * 8);
        puStack_20 != (undefined8 *)0x0; puStack_20 = (undefined8 *)puStack_20[3]) {
      Memory::Recycler::PrintPinnedObjectStackTraces::anon_class_8_1_8991fb9c::operator()
                ((anon_class_8_1_8991fb9c *)&this_local,(void *)*puStack_20,
                 (PinRecord *)(puStack_20 + 1));
    }
  }
  return;
}

Assistant:

void Map(Fn fn)
    {
        EntryType *current;
        for (uint i=0;i<size;i++) {
            for (current = table[i] ; current != nullptr; current = current->next) {
                fn(current->key,current->value);
            }
        }
    }